

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTExecutionInfo.cpp
# Opt level: O1

FunctionBody * __thiscall
TTD::TTDebuggerSourceLocation::UpdatePostInflateFunctionBody_Helper
          (TTDebuggerSourceLocation *this,FunctionBody *rootBody)

{
  ULONG UVar1;
  NestedArray *pNVar2;
  uint uVar3;
  ULONG UVar4;
  ParseableFunctionInfo *pfi;
  FunctionBody *pFVar5;
  FunctionBody *unaff_R13;
  uint32 i;
  uint index;
  bool bVar6;
  
  index = 0;
  do {
    pNVar2 = (rootBody->super_ParseableFunctionInfo).nestedArray.ptr;
    uVar3 = 0;
    if (pNVar2 != (NestedArray *)0x0) {
      uVar3 = pNVar2->nestedCount;
    }
    if (uVar3 <= index) {
      return (FunctionBody *)0x0;
    }
    pfi = Js::ParseableFunctionInfo::GetNestedFunctionForExecution
                    (&rootBody->super_ParseableFunctionInfo,index);
    pFVar5 = JsSupport::ForceAndGetFunctionBody(pfi);
    UVar1 = this->m_functionLine;
    UVar4 = Js::ParseableFunctionInfo::GetLineNumber(&pFVar5->super_ParseableFunctionInfo);
    if ((UVar1 == UVar4) &&
       (UVar1 = this->m_functionColumn,
       UVar4 = Js::ParseableFunctionInfo::GetColumnNumber(&pFVar5->super_ParseableFunctionInfo),
       UVar1 == UVar4)) {
      bVar6 = false;
      unaff_R13 = pFVar5;
    }
    else {
      pFVar5 = UpdatePostInflateFunctionBody_Helper(this,pFVar5);
      bVar6 = pFVar5 == (FunctionBody *)0x0;
      if (!bVar6) {
        unaff_R13 = pFVar5;
      }
    }
    index = index + 1;
  } while (bVar6);
  return unaff_R13;
}

Assistant:

Js::FunctionBody* TTDebuggerSourceLocation::UpdatePostInflateFunctionBody_Helper(Js::FunctionBody* rootBody) const
    {
        for(uint32 i = 0; i < rootBody->GetNestedCount(); ++i)
        {
            Js::ParseableFunctionInfo* ipfi = rootBody->GetNestedFunctionForExecution(i);
            Js::FunctionBody* ifb = JsSupport::ForceAndGetFunctionBody(ipfi);

            if(this->m_functionLine == ifb->GetLineNumber() && this->m_functionColumn == ifb->GetColumnNumber())
            {
                return ifb;
            }
            else
            {
                Js::FunctionBody* found = this->UpdatePostInflateFunctionBody_Helper(ifb);
                if(found != nullptr)
                {
                    return found;
                }
            }
        }

        return nullptr;
    }